

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_reconnect.cc
# Opt level: O0

int runReconnect(string *command,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  const_iterator this;
  const_iterator mac;
  reference this_00;
  int in_ESI;
  ForceIP force_ip;
  DeviceInfo *device;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  string answer;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  invalid_argument *ex;
  bool in_stack_00000135;
  bool in_stack_00000136;
  bool in_stack_00000137;
  string p;
  int i;
  bool yes;
  DeviceFilter device_filter;
  string *in_stack_fffffffffffffe08;
  DeviceFilter *in_stack_fffffffffffffe10;
  ostream *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe40;
  ostream *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffebc;
  string local_120 [60];
  int local_e4;
  allocator<char> local_c1;
  string local_c0 [24];
  DeviceFilter *in_stack_ffffffffffffff58;
  int local_a0;
  undefined1 local_98 [8];
  DeviceFilter *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  undefined1 auStack_80 [4];
  int in_stack_ffffffffffffff84;
  undefined1 auStack_68 [24];
  undefined1 auStack_50 [24];
  undefined1 auStack_38 [36];
  int local_14;
  int local_4;
  
  local_14 = in_ESI;
  memset(local_98,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135311);
  memset(auStack_80,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13533e);
  memset(auStack_68,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13536b);
  memset(auStack_50,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135398);
  memset(auStack_38,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1353c5);
  bVar2 = false;
  local_a0 = 0;
  do {
    if (local_14 <= local_a0) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe20);
      if (((bVar1) &&
          (bVar1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffe20), bVar1)) &&
         (bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffe20), bVar1)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"No filter set");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        printHelp((ostream *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_4 = 1;
        local_e4 = 1;
      }
      else {
        discoverWithFilter(in_stack_ffffffffffffff58);
        bVar1 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::empty
                          ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                            *)in_stack_fffffffffffffe20);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"No device found");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_4 = 0;
          local_e4 = 1;
          goto LAB_00135b00;
        }
        std::operator<<((ostream *)&std::cout,"Reconnecting the following devices:\n");
        printDeviceTable((ostream *)p._M_string_length,
                         (vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                         p._0_8_,in_stack_00000137,in_stack_00000136,in_stack_00000135);
        if (!bVar2) {
          std::operator<<((ostream *)&std::cout,"Are you sure? [y/N] ");
          std::__cxx11::string::string(local_120);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,local_120);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
          if ((bVar2) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08
                                     ), bVar2)) {
            in_stack_fffffffffffffe20 = std::operator<<((ostream *)&std::cout,"Cancel");
            std::ostream::operator<<
                      (in_stack_fffffffffffffe20,std::endl<char,std::char_traits<char>>);
            local_4 = 0;
            local_e4 = 1;
          }
          else {
            local_e4 = 0;
          }
          std::__cxx11::string::~string(local_120);
          if (local_e4 != 0) goto LAB_00135b00;
        }
        this = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                         ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *
                          )in_stack_fffffffffffffe08);
        mac = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                        ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                         in_stack_fffffffffffffe08);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                   *)in_stack_fffffffffffffe10,
                                  (__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                   *)in_stack_fffffffffffffe08), bVar2) {
          this_00 = __gnu_cxx::
                    __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                    ::operator*((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                 *)&stack0xfffffffffffffed0);
          rcdiscover::ForceIP::ForceIP((ForceIP *)in_stack_fffffffffffffe40);
          rcdiscover::DeviceInfo::getMAC(this_00);
          rcdiscover::ForceIP::sendCommand
                    ((ForceIP *)this._M_current,(uint64_t)mac._M_current,
                     (uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,in_stack_fffffffffffffebc)
          ;
          rcdiscover::ForceIP::~ForceIP((ForceIP *)0x135a88);
          __gnu_cxx::
          __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
          ::operator++((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                        *)&stack0xfffffffffffffed0);
        }
        in_stack_fffffffffffffe10 = (DeviceFilter *)std::operator<<((ostream *)&std::cout,"Done");
        std::ostream::operator<<(in_stack_fffffffffffffe10,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
        local_e4 = 1;
LAB_00135b00:
        std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                  ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                   in_stack_fffffffffffffe20);
      }
      break;
    }
    local_a0 = local_a0 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
              );
    std::allocator<char>::~allocator(&local_c1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    if (bVar1) {
      bVar2 = true;
LAB_001356e6:
      local_e4 = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
      if (bVar1) {
        iVar3 = parseFilterArguments
                          (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
        local_a0 = iVar3 + local_a0;
        goto LAB_001356e6;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08),
         bVar1)) {
        printHelp((ostream *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_4 = 0;
        local_e4 = 1;
      }
      else {
        in_stack_fffffffffffffe50 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        in_stack_fffffffffffffe48 = std::operator<<((ostream *)in_stack_fffffffffffffe50,local_c0);
        std::operator<<(in_stack_fffffffffffffe48,'\n');
        printHelp((ostream *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_4 = 1;
        local_e4 = 1;
      }
    }
    std::__cxx11::string::~string(local_c0);
  } while (local_e4 == 0);
  DeviceFilter::~DeviceFilter(in_stack_fffffffffffffe10);
  return local_4;
}

Assistant:

int runReconnect(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  int i=0;
  while (i < argc)
  {
    std::string p=argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  std::cout << "Reconnecting the following devices:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::ForceIP force_ip;
    force_ip.sendCommand(device.getMAC(), 0, 0, 0);
  }

  std::cout << "Done" << std::endl;

  return 0;
}